

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x86_64.c
# Opt level: O1

void x86_64_pbsload(dill_stream s,int type,int junk,int dest,int src1,int src2)

{
  uint rex;
  uint dest_00;
  int iVar1;
  
  if (type == 9) {
    iVar1 = 4;
  }
  else {
    dest_00 = dest;
    iVar1 = type;
    if (type != 10) goto LAB_00119d08;
    iVar1 = 6;
  }
  dest_00 = 0;
LAB_00119d08:
  x86_64_pload(s,iVar1,junk,dest_00,src1,src2);
  if (8 < type - 2U) {
    return;
  }
  rex = (uint)(7 < (int)dest_00);
  switch(type) {
  case 2:
  case 3:
    BYTE_OUT2R(s,rex,0xf,dest_00 & 7 | 200);
    x86_64_rshi(s,dest_00,dest_00,0x10);
    return;
  default:
    rex = rex | 8;
  case 4:
  case 5:
    BYTE_OUT2R(s,rex,0xf,dest_00 & 7 | 200);
    return;
  case 9:
    BYTE_OUT2R(s,0,0xf,200);
    iVar1 = (uint)(7 < dest) << 2;
    break;
  case 10:
    iVar1 = (uint)(7 < dest) * 4 + 8;
    BYTE_OUT2R(s,8,0xf,200);
  }
  BYTE_OUT1R3(s,0x66,iVar1,0x6e,(dest & 0x1fU | 0x18) << 3,src2);
  return;
}

Assistant:

extern void
x86_64_pbsload(dill_stream s, int type, int junk, int dest, int src1, int src2)
{
    int rex = 0;
    int fdest = dest;
    int ltype = type;
    switch (type) {
    case DILL_D:
        ltype = DILL_L;
        fdest = dest;
        dest = EAX;
        break;
    case DILL_F:
        ltype = DILL_I;
        fdest = dest;
        dest = EAX;
        break;
    }
    if (dest > RDI)
        rex |= REX_B;
    x86_64_pload(s, ltype, junk, dest, src1, src2);
    switch (type) {
    case DILL_F:
        rex = 0;
        x86_64_bswap(s, 0, DILL_I, EAX, EAX);
        if (fdest > RDI)
            rex |= REX_R;
        BYTE_OUT1R3(s, 0x66, rex, 0x0f, 0x6e, ModRM(0x3, fdest, EAX));
        break;
    case DILL_D:
        rex = REX_W;
        if (fdest > RDI)
            rex |= REX_R;
        x86_64_bswap(s, 0, DILL_L, EAX, EAX);
        BYTE_OUT1R3(s, 0x66, rex, 0x0f, 0x6e, ModRM(0x3, fdest, EAX));
        break;
    case DILL_L:
    case DILL_UL:
    case DILL_P:
        rex |= REX_W;
    case DILL_I:
    case DILL_U:
        BYTE_OUT2R(s, rex, 0x0f, 0xc8 + (dest & 0x7)); /* byteswap dest */
        break;
    case DILL_S:
    case DILL_US:
        /* byteswap 32 bits and shift down 16 */
        BYTE_OUT2R(s, rex, 0x0f, 0xc8 + (dest & 0x7)); /* byteswap dest */
        x86_64_rshi(s, dest, dest, 16);
        break;
    case DILL_C:
    case DILL_UC:
        break;
    }
}